

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

bool __thiscall
helics::apps::Connector::checkPotentialConnection
          (Connector *this,string_view interfaceName,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *possibleConnections,
          unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
          *potentials,
          vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
          *potentialTemplates,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view interface;
  string_view interface_00;
  string_view target;
  bool bVar1;
  int iVar2;
  char *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  Connector *in_RSI;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_RDI;
  char *in_R8;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_R9;
  undefined8 in_stack_00000010;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_00000070;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
  *in_stack_00000078;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000080;
  Connector *in_stack_00000088;
  basic_string_view<char,_std::char_traits<char>_> *alias;
  iterator __end3;
  iterator __begin3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  int matched;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_00000190;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_00000198;
  undefined1 in_stack_000001b0 [16];
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_000001d0;
  anon_class_1_0_00000001 *__f;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined4 in_stack_fffffffffffffea0;
  _Self local_100;
  _Self local_f8;
  undefined1 *local_f0;
  undefined1 local_d8 [40];
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_ffffffffffffff50;
  Connector *in_stack_ffffffffffffff58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff60;
  Connector *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  char *in_stack_ffffffffffffff78;
  anon_class_1_0_00000001 local_78 [60];
  int local_3c;
  char *pcVar4;
  char *pcVar5;
  byte local_1;
  
  __f = local_78;
  pcVar4 = in_R8;
  pcVar5 = in_RCX;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::apps::Connector::checkPotentialConnection(std::basic_string_view<char,std::char_traits<char>>,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::unordered_set<std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&,std::unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::apps::PotentialConnections,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>>&,std::vector<helics::apps::TemplateMatcher,std::allocator<helics::apps::TemplateMatcher>>&,std::unordered_multimap<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>const&)::__0&,void>
            (in_RDI,__f);
  iVar2 = makeTargetConnection
                    ((Connector *)aliases,(string_view)in_stack_000001b0,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)potentialTemplates,
                     in_stack_00000198,in_stack_00000190,in_stack_000001d0);
  CLI::std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x1f1b1b);
  if (iVar2 < 1) {
    interface._M_str = in_stack_ffffffffffffff78;
    interface._M_len = (size_t)in_RDX;
    this_00 = in_RSI;
    pvVar3 = in_RDX;
    local_3c = iVar2;
    bVar1 = makePotentialConnection
                      (in_RSI,interface,in_stack_ffffffffffffff60,
                       (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                        *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if (bVar1) {
      local_1 = 1;
    }
    else {
      bVar1 = CLI::std::
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              ::empty((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                       *)in_RDI);
      if ((bVar1) ||
         (bVar1 = makePotentialTemplateConnection
                            (in_stack_00000088,_alias,in_stack_00000080,in_stack_00000078,
                             in_stack_00000070), in_stack_ffffffffffffff58 = in_RSI,
         in_stack_ffffffffffffff60 = in_RDX, !bVar1)) {
        bVar1 = CLI::std::
                unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)0x1f1c4d);
        if (!bVar1) {
          target._M_str = pcVar5;
          target._M_len = (size_t)pcVar4;
          generateAliases(target,in_R9);
          local_f0 = local_d8;
          local_f8._M_node =
               (_Base_ptr)
               CLI::std::
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)__f);
          local_100._M_node =
               (_Base_ptr)
               CLI::std::
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)__f);
          while (bVar1 = CLI::std::operator==(&local_f8,&local_100), ((bVar1 ^ 0xffU) & 1) != 0) {
            CLI::std::
            _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
            operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)0x1f1d01);
            __x._M_str._0_4_ = in_stack_fffffffffffffea0;
            __x._M_len = in_stack_00000010;
            __x._M_str._4_4_ = iVar2;
            __y._M_str = in_R8;
            __y._M_len = (size_t)in_RCX;
            bVar1 = std::operator==(__x,__y);
            if (!bVar1) {
              interface_00._M_str = in_stack_ffffffffffffff78;
              interface_00._M_len = (size_t)pvVar3;
              in_stack_fffffffffffffe77 =
                   makePotentialConnection
                             (this_00,interface_00,in_stack_ffffffffffffff60,
                              (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                               *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
              if ((bool)in_stack_fffffffffffffe77) {
                local_1 = 1;
                bVar1 = true;
                goto LAB_001f1e80;
              }
              bVar1 = CLI::std::
                      vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                      ::empty((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                               *)in_RDI);
              if ((!bVar1) &&
                 (in_stack_fffffffffffffe76 =
                       makePotentialTemplateConnection
                                 (in_stack_00000088,_alias,in_stack_00000080,in_stack_00000078,
                                  in_stack_00000070), (bool)in_stack_fffffffffffffe76)) {
                local_1 = 1;
                bVar1 = true;
                goto LAB_001f1e80;
              }
            }
            CLI::std::
            _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
            operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe77,
                                   CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
          }
          bVar1 = false;
LAB_001f1e80:
          CLI::std::
          set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x1f1e8d);
          if (bVar1) goto LAB_001f1ea3;
        }
        local_1 = 0;
      }
      else {
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 1;
  }
LAB_001f1ea3:
  return (bool)(local_1 & 1);
}

Assistant:

bool Connector::checkPotentialConnection(
    std::string_view interfaceName,
    const std::vector<std::size_t>& tagList,
    std::unordered_set<std::string_view>& possibleConnections,
    std::unordered_map<std::string_view, PotentialConnections>& potentials,
    std::vector<TemplateMatcher>& potentialTemplates,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases)
{
    static auto nullConnector = [](std::string_view, std::string_view) {};
    /** potential inputs*/
    auto matched =
        makeTargetConnection(interfaceName, tagList, possibleConnections, aliases, nullConnector);
    if (matched > 0) {
        return true;
    }
    if (makePotentialConnection(interfaceName, tagList, potentials, aliases)) {
        return true;
    }
    if (!potentialTemplates.empty()) {
        if (makePotentialTemplateConnection(interfaceName, tagList, potentialTemplates, aliases)) {
            return true;
        }
    }
    if (!aliases.empty()) {
        auto aliasList = generateAliases(interfaceName, aliases);
        for (const auto& alias : aliasList) {
            if (alias == interfaceName) {
                continue;
            }
            if (makePotentialConnection(alias, tagList, potentials, aliases)) {
                return true;
            }
            if (!potentialTemplates.empty()) {
                if (makePotentialTemplateConnection(alias, tagList, potentialTemplates, aliases)) {
                    return true;
                }
            }
        }
    }
    return false;
}